

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int select_negotiated_group
              (ptls_key_exchange_algorithm_t **selected,ptls_key_exchange_algorithm_t **candidates,
              uint8_t *src,uint8_t *end)

{
  int iVar1;
  ushort *puVar2;
  ptls_key_exchange_algorithm_t **pppVar3;
  ushort *puVar4;
  ulong uVar5;
  ptls_key_exchange_algorithm_t *ppVar6;
  
  iVar1 = 0x32;
  if (1 < (ulong)((long)end - (long)src)) {
    uVar5 = (ulong)(ushort)(*(ushort *)src << 8 | *(ushort *)src >> 8);
    puVar4 = (ushort *)(src + 2);
    if (uVar5 <= (ulong)((long)end - (long)puVar4)) {
      puVar2 = puVar4;
      if (uVar5 != 0) {
        puVar2 = (ushort *)(src + uVar5 + 2);
        do {
          if ((long)puVar2 - (long)puVar4 < 2) {
            return 0x32;
          }
          ppVar6 = *candidates;
          if (ppVar6 != (ptls_key_exchange_algorithm_t *)0x0) {
            pppVar3 = candidates + 1;
            do {
              if (ppVar6->id == (uint16_t)(*puVar4 << 8 | *puVar4 >> 8)) {
                *selected = ppVar6;
                return 0;
              }
              ppVar6 = *pppVar3;
              pppVar3 = pppVar3 + 1;
            } while (ppVar6 != (ptls_key_exchange_algorithm_t *)0x0);
          }
          puVar4 = puVar4 + 1;
        } while (puVar4 != puVar2);
      }
      iVar1 = 0x32;
      if (puVar2 == (ushort *)end) {
        iVar1 = 0x28;
      }
    }
  }
  return iVar1;
}

Assistant:

static int select_negotiated_group(ptls_key_exchange_algorithm_t **selected, ptls_key_exchange_algorithm_t **candidates,
                                   const uint8_t *src, const uint8_t *const end)
{
    int ret;

    ptls_decode_block(src, end, 2, {
        while (src != end) {
            uint16_t group;
            if ((ret = ptls_decode16(&group, &src, end)) != 0)
                goto Exit;
            ptls_key_exchange_algorithm_t **c = candidates;
            for (; *c != NULL; ++c) {
                if ((*c)->id == group) {
                    *selected = *c;
                    return 0;
                }
            }
        }
    });

    ret = PTLS_ALERT_HANDSHAKE_FAILURE;

Exit:
    return ret;
}